

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O2

bool __thiscall
cmExportFileGenerator::AddTargetNamespace
          (cmExportFileGenerator *this,string *input,cmGeneratorTarget *target,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *missingTargets)

{
  bool bVar1;
  cmLocalGenerator *this_00;
  cmGeneratorTarget *this_01;
  iterator iVar2;
  string *this_02;
  cmGeneratorTarget *tgt;
  string namespacedTarget;
  cmGeneratorTarget *local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  this_00 = cmGeneratorTarget::GetLocalGenerator(target);
  this_01 = cmLocalGenerator::FindGeneratorTargetToUse(this_00,input);
  if (this_01 != (cmGeneratorTarget *)0x0) {
    local_70 = this_01;
    bVar1 = cmGeneratorTarget::IsImported(this_01);
    if (!bVar1) {
      iVar2 = std::
              _Rb_tree<cmGeneratorTarget_*,_cmGeneratorTarget_*,_std::_Identity<cmGeneratorTarget_*>,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
              ::find(&(this->ExportedTargets)._M_t,&local_70);
      if ((_Rb_tree_header *)iVar2._M_node ==
          &(this->ExportedTargets)._M_t._M_impl.super__Rb_tree_header) {
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        local_68._M_string_length = 0;
        local_68.field_2._M_local_buf[0] = '\0';
        (*this->_vptr_cmExportFileGenerator[4])(this,&local_68,missingTargets,target,local_70);
        if (local_68._M_string_length != 0) {
          std::__cxx11::string::_M_assign((string *)input);
        }
        this_02 = &local_68;
      }
      else {
        cmGeneratorTarget::GetExportName_abi_cxx11_(&local_48,local_70);
        std::operator+(&local_68,&this->Namespace,&local_48);
        std::__cxx11::string::operator=((string *)input,(string *)&local_68);
        std::__cxx11::string::~string((string *)&local_68);
        this_02 = &local_48;
      }
      std::__cxx11::string::~string((string *)this_02);
    }
  }
  return this_01 != (cmGeneratorTarget *)0x0;
}

Assistant:

bool
cmExportFileGenerator::AddTargetNamespace(std::string &input,
                                    cmGeneratorTarget* target,
                                    std::vector<std::string> &missingTargets)
{
  cmLocalGenerator *lg = target->GetLocalGenerator();

  cmGeneratorTarget *tgt = lg->FindGeneratorTargetToUse(input);
  if (!tgt)
    {
    return false;
    }

  if(tgt->IsImported())
    {
    return true;
    }
  if(this->ExportedTargets.find(tgt) != this->ExportedTargets.end())
    {
    input = this->Namespace + tgt->GetExportName();
    }
  else
    {
    std::string namespacedTarget;
    this->HandleMissingTarget(namespacedTarget, missingTargets,
                              target, tgt);
    if (!namespacedTarget.empty())
      {
      input = namespacedTarget;
      }
    }
  return true;
}